

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

void __thiscall wasm::MultiMemoryLowering::makeOffsetGlobals(MultiMemoryLowering *this)

{
  pointer *ppNVar1;
  Memory *pMVar2;
  char *pcVar3;
  IString *this_00;
  iterator __position;
  mapped_type *pmVar4;
  long *plVar5;
  long *plVar6;
  pointer puVar7;
  long lVar8;
  mapped_type mVar9;
  ulong uVar10;
  string_view sVar11;
  anon_class_8_1_8991fb9c local_a0;
  anon_class_8_1_8991fb9c addGlobal;
  long *local_80 [2];
  long local_70 [2];
  undefined1 auStack_60 [8];
  Name name;
  long local_40;
  long lStack_38;
  
  puVar7 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar7) {
    uVar10 = 0;
    lVar8 = 0;
    local_a0.this = this;
    do {
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->memoryIdxMap,
                            (key_type *)
                            puVar7[uVar10]._M_t.
                            super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
      mVar9 = (mapped_type)uVar10;
      *pmVar4 = mVar9;
      if (mVar9 != 0) {
        addGlobal.this = (MultiMemoryLowering *)this->wasm;
        pMVar2 = puVar7[uVar10]._M_t.
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        pcVar3 = *(char **)((long)&(pMVar2->super_Importable).super_Named + 8);
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,pcVar3,
                   pcVar3 + *(long *)&(pMVar2->super_Importable).super_Named);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_80);
        name.super_IString.str._M_str = (char *)&local_40;
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_40 = *plVar6;
          lStack_38 = plVar5[3];
        }
        else {
          local_40 = *plVar6;
          name.super_IString.str._M_str = (char *)*plVar5;
        }
        this_00 = (IString *)plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        sVar11._M_str = (char *)0x0;
        sVar11._M_len = (size_t)name.super_IString.str._M_str;
        sVar11 = IString::interned(this_00,sVar11,SUB81(plVar6,0));
        _auStack_60 = (string_view)Names::getValidGlobalName((Module *)addGlobal.this,(Name)sVar11);
        if ((long *)name.super_IString.str._M_str != &local_40) {
          operator_delete(name.super_IString.str._M_str,local_40 + 1);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        __position._M_current =
             (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                    (&this->offsetGlobalNames,__position,(Name *)auStack_60);
        }
        else {
          ((__position._M_current)->super_IString).str._M_len = (size_t)auStack_60;
          ((__position._M_current)->super_IString).str._M_str =
               (char *)name.super_IString.str._M_len;
          ppNVar1 = &(this->offsetGlobalNames).
                     super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppNVar1 = *ppNVar1 + 1;
        }
        makeOffsetGlobals::anon_class_8_1_8991fb9c::operator()
                  (&local_a0,(Name)_auStack_60,lVar8 << 0x10);
      }
      lVar8 = lVar8 + ((puVar7[uVar10]._M_t.
                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->initial).addr;
      uVar10 = (ulong)(mVar9 + 1);
      puVar7 = (this->wasm->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->wasm->memories).
                                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3))
    ;
  }
  return;
}

Assistant:

void makeOffsetGlobals() {
    auto addGlobal = [&](Name name, size_t offset) {
      auto global = Builder::makeGlobal(
        name,
        pointerType,
        Builder(*wasm).makeConst(Literal::makeFromInt64(offset, pointerType)),
        Builder::Mutable);
      wasm->addGlobal(std::move(global));
    };

    size_t offsetRunningTotal = 0;
    for (Index i = 0; i < wasm->memories.size(); i++) {
      auto& memory = wasm->memories[i];
      memoryIdxMap[memory->name] = i;
      // We don't need a page offset global for the first memory as it's always
      // 0
      if (i != 0) {
        Name name = Names::getValidGlobalName(
          *wasm, memory->name.toString() + "_byte_offset");
        offsetGlobalNames.push_back(std::move(name));
        addGlobal(name, offsetRunningTotal * Memory::kPageSize);
      }
      offsetRunningTotal += memory->initial;
    }
  }